

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

Proto * luaF_newproto(lua_State *L)

{
  Proto *pPVar1;
  
  pPVar1 = (Proto *)luaC_newobj(L,9,0x90);
  if (pPVar1->tt == '\t') {
    pPVar1->numparams = '\0';
    pPVar1->is_vararg = '\0';
    pPVar1->maxstacksize = '\0';
    (pPVar1->ravi_jit).jit_status = '\0';
    (pPVar1->ravi_jit).jit_flags = '\0';
    (pPVar1->ravi_jit).execution_count = 0;
    pPVar1->sizeupvalues = 0;
    pPVar1->sizek = 0;
    pPVar1->sizecode = 0;
    pPVar1->sizelineinfo = 0;
    pPVar1->sizep = 0;
    pPVar1->sizelocvars = 0;
    pPVar1->linedefined = 0;
    pPVar1->lastlinedefined = 0;
    pPVar1->k = (TValue *)0x0;
    pPVar1->code = (Instruction *)0x0;
    pPVar1->p = (Proto **)0x0;
    pPVar1->lineinfo = (int *)0x0;
    pPVar1->k = (TValue *)0x0;
    pPVar1->code = (Instruction *)0x0;
    pPVar1->p = (Proto **)0x0;
    pPVar1->lineinfo = (int *)0x0;
    pPVar1->locvars = (LocVar *)0x0;
    pPVar1->upvalues = (Upvaldesc *)0x0;
    pPVar1->cache = (LClosure *)0x0;
    pPVar1->source = (TString *)0x0;
    (pPVar1->ravi_jit).jit_data = (void *)SUB168(ZEXT416(0) << 0x40,0);
    (pPVar1->ravi_jit).jit_function = (lua_CFunction)SUB168(ZEXT416(0) << 0x40,8);
    return pPVar1;
  }
  __assert_fail("(o)->tt == 9",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lfunc.c"
                ,200,"Proto *luaF_newproto(lua_State *)");
}

Assistant:

Proto *luaF_newproto (lua_State *L) {
  GCObject *o = luaC_newobj(L, LUA_TPROTO, sizeof(Proto));
  Proto *f = gco2p(o);
  f->k = NULL;
  f->sizek = 0;
  f->p = NULL;
  f->sizep = 0;
  f->code = NULL;
  f->cache = NULL;
  f->sizecode = 0;
  f->lineinfo = NULL;
  f->sizelineinfo = 0;
  f->upvalues = NULL;
  f->sizeupvalues = 0;
  f->numparams = 0;
  f->is_vararg = 0;
  f->maxstacksize = 0;
  f->locvars = NULL;
  f->sizelocvars = 0;
  f->linedefined = 0;
  f->lastlinedefined = 0;
  f->source = NULL;
  f->ravi_jit.jit_data = NULL;
  f->ravi_jit.jit_function = NULL;
  f->ravi_jit.jit_status = RAVI_JIT_NOT_COMPILED; /* not compiled */
  f->ravi_jit.jit_flags = RAVI_JIT_FLAG_NONE; /* no loop */
  f->ravi_jit.execution_count = 0; /* number of times function execution (capped) */
  return f;
}